

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

Amount cfd::core::ConfidentialValue::ConvertFromConfidentialValue(ByteData *value)

{
  undefined1 auVar1 [12];
  CfdException *this;
  Amount AVar2;
  allocator local_5d;
  int ret;
  uint64_t satoshi;
  undefined1 local_50 [32];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,value);
  satoshi = 0;
  ret = wally_tx_confidential_value_to_satoshi
                  (local_30._M_impl.super__Vector_impl_data._M_start,
                   (long)local_30._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_30._M_impl.super__Vector_impl_data._M_start,&satoshi);
  if (ret == 0) {
    AVar2 = Amount::CreateBySatoshiAmount(satoshi);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
    auVar1 = AVar2._0_12_;
    AVar2._12_4_ = 0;
    AVar2.amount_ = auVar1._0_8_;
    AVar2.ignore_check_ = (bool)auVar1[8];
    AVar2._9_3_ = auVar1._9_3_;
    return AVar2;
  }
  local_50._0_8_ = "cfdcore_elements_transaction.cpp";
  local_50._8_4_ = 0x297;
  local_50._16_8_ = "ConvertFromConfidentialValue";
  logger::warn<int&>((CfdSourceLocation *)local_50,"wally_tx_confidential_value_to_satoshi NG[{}].",
                     &ret);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_50,"convert from confidential value error.",&local_5d);
  CfdException::CfdException(this,kCfdIllegalStateError,(string *)local_50);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Amount ConfidentialValue::ConvertFromConfidentialValue(  // force LF
    const ByteData &value) {
  const std::vector<uint8_t> &buffer = value.GetBytes();
  uint64_t satoshi = 0;
  int ret = wally_tx_confidential_value_to_satoshi(
      buffer.data(), buffer.size(), &satoshi);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_confidential_value_to_satoshi NG[{}].", ret);
    throw CfdException(
        kCfdIllegalStateError, "convert from confidential value error.");
  }
  return Amount::CreateBySatoshiAmount(static_cast<int64_t>(satoshi));
}